

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O1

bool __thiscall cmInstallCommandArguments::CheckPermissions(cmInstallCommandArguments *this)

{
  string *permissions;
  bool bVar1;
  string *onePermission;
  bool bVar2;
  
  permissions = &this->PermissionsString;
  std::__cxx11::string::_M_replace
            ((ulong)permissions,0,(char *)(this->PermissionsString)._M_string_length,0x59b99e);
  onePermission =
       (this->Permissions).Vector.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bVar2 = onePermission ==
          (this->Permissions).Vector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if ((!bVar2) && (bVar1 = CheckPermissions(onePermission,permissions), bVar1)) {
    do {
      onePermission = onePermission + 1;
      bVar2 = onePermission ==
              (this->Permissions).Vector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar2) {
        return bVar2;
      }
      bVar1 = CheckPermissions(onePermission,permissions);
    } while (bVar1);
  }
  return bVar2;
}

Assistant:

bool cmInstallCommandArguments::CheckPermissions()
{
  this->PermissionsString = "";
  for (std::vector<std::string>::const_iterator permIt =
         this->Permissions.GetVector().begin();
       permIt != this->Permissions.GetVector().end(); ++permIt) {
    if (!this->CheckPermissions(*permIt, this->PermissionsString)) {
      return false;
    }
  }
  return true;
}